

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O3

void CombinationKeygenRecurse<Blob<128>,unsigned_long>
               (unsigned_long *key,int len,int maxlen,unsigned_long *blocks,int blockcount,
               pfHash hash,vector<Blob<128>,_std::allocator<Blob<128>_>_> *hashes)

{
  ulong uVar1;
  Blob<128> h;
  value_type local_48;
  
  if (0 < blockcount && len != maxlen) {
    uVar1 = 0;
    do {
      key[len] = blocks[uVar1];
      local_48.bytes[0] = '\0';
      local_48.bytes[1] = '\0';
      local_48.bytes[2] = '\0';
      local_48.bytes[3] = '\0';
      local_48.bytes[4] = '\0';
      local_48.bytes[5] = '\0';
      local_48.bytes[6] = '\0';
      local_48.bytes[7] = '\0';
      local_48.bytes[8] = '\0';
      local_48.bytes[9] = '\0';
      local_48.bytes[10] = '\0';
      local_48.bytes[0xb] = '\0';
      local_48.bytes[0xc] = '\0';
      local_48.bytes[0xd] = '\0';
      local_48.bytes[0xe] = '\0';
      local_48.bytes[0xf] = '\0';
      (*hash)(key,len * 8 + 8,0,&local_48);
      std::vector<Blob<128>,_std::allocator<Blob<128>_>_>::push_back(hashes,&local_48);
      CombinationKeygenRecurse<Blob<128>,unsigned_long>
                (key,len + 1,maxlen,blocks,blockcount,hash,hashes);
      uVar1 = uVar1 + 1;
    } while ((uint)blockcount != uVar1);
  }
  return;
}

Assistant:

void CombinationKeygenRecurse ( blocktype * key, int len, int maxlen,
                  blocktype * blocks, int blockcount,
                  pfHash hash, std::vector<hashtype> & hashes )
{
  if(len == maxlen) return;  // end recursion

  for(int i = 0; i < blockcount; i++)
  {
    key[len] = blocks[i];

    //if(len == maxlen-1)
    {
      hashtype h;
      hash(key, (len+1) * sizeof(blocktype), 0, &h);
      hashes.push_back(h);
    }

    //else
    {
      CombinationKeygenRecurse(key,len+1,maxlen,blocks,blockcount,hash,hashes);
    }
  }
}